

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString BracketsFormattedHexStringFrom(int value)

{
  size_t extraout_RDX;
  char *in_RDI;
  SimpleString SVar1;
  SimpleString *in_stack_00000018;
  
  HexStringFrom((int)((ulong)in_RDI >> 0x20));
  BracketsFormattedHexString(in_stack_00000018);
  SimpleString::~SimpleString((SimpleString *)0x172d67);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = in_RDI;
  return SVar1;
}

Assistant:

SimpleString BracketsFormattedHexStringFrom(int value)
{
    return BracketsFormattedHexString(HexStringFrom(value));
}